

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O0

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Prealloc
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,uint32_t max_sequence_len,
          uint8_t alphabet_size)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  invalid_argument *this_00;
  int64_t iVar4;
  bad_alloc *ba_1;
  bad_alloc *ba;
  int64_t worst_case_score;
  uint8_t alphabet_size_local;
  uint32_t max_sequence_len_local;
  SimdAlignmentEngine<(spoa::Architecture)3> *this_local;
  
  uVar2 = std::numeric_limits<int>::max();
  if (max_sequence_len <= uVar2) {
    iVar4 = AlignmentEngine::WorstCaseAlignmentScore
                      (&this->super_AlignmentEngine,(ulong)max_sequence_len + 8,
                       (ulong)max_sequence_len * (ulong)alphabet_size);
    iVar3 = std::numeric_limits<int>::min();
    if (iVar3 + 0x400 <= iVar4) {
      sVar1 = std::numeric_limits<short>::min();
      if (iVar4 < sVar1 + 0x400) {
        Realloc(this,(ulong)((max_sequence_len >> 3) + 1),
                (ulong)max_sequence_len * (ulong)alphabet_size,alphabet_size);
      }
      else {
        Realloc(this,(ulong)((max_sequence_len >> 4) + 1),
                (ulong)max_sequence_len * (ulong)alphabet_size,alphabet_size);
      }
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[spoa::SimdAlignmentEngine::Prealloc] error: too large sequence!");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void SimdAlignmentEngine<A>::Prealloc(
    std::uint32_t max_sequence_len,
    std::uint8_t alphabet_size) {
  if (max_sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SimdAlignmentEngine::Prealloc] error: too large sequence!");
  }

#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)

  std::int64_t worst_case_score = WorstCaseAlignmentScore(
      static_cast<std::int64_t>(max_sequence_len) + 8,
      static_cast<std::int64_t>(max_sequence_len) * alphabet_size);

  if (worst_case_score < std::numeric_limits<std::int32_t>::min() + 1024) {
    return;
  } else if (worst_case_score < std::numeric_limits<std::int16_t>::min() + 1024) {  // NOLINT
    try {
      Realloc(
          (max_sequence_len / InstructionSet<A, std::int32_t>::kNumVar) + 1,
          static_cast<std::uint64_t>(max_sequence_len) * alphabet_size,
          alphabet_size);
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Prealloc] error: insufficient memory!");
    }
  } else {
    try {
      Realloc(
          (max_sequence_len / InstructionSet<A, std::int16_t>::kNumVar) + 1,
          static_cast<std::uint64_t>(max_sequence_len) * alphabet_size,
          alphabet_size);
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Prealloc] error: insufficient memory!");
    }
  }

#endif
  (void) alphabet_size;
}